

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  type *Val;
  undefined7 in_register_00000009;
  uint i;
  ulong index;
  undefined8 local_40;
  void *SaveInfo;
  
  SaveInfo = (void *)CONCAT71(in_register_00000009,param_3);
  uVar3 = (**(code **)(*(long *)this + 0x40))();
  cVar2 = (**(code **)(*(long *)this + 0x10))(this);
  uVar1 = *(int *)&io->Ctxt - *(int *)&io->_vptr_IO;
  if (cVar2 == '\0') {
    uVar1 = uVar3;
  }
  for (index = 0; uVar1 != index; index = index + 1) {
    cVar2 = (**(code **)(*(long *)this + 0x48))(this,index & 0xffffffff,&local_40);
    if (cVar2 != '\0') {
      Val = SequenceTraitsImpl<std::vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>,_true>
            ::element((IO *)this,(vector<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_> *)io,
                      index);
      yamlize<llvm::yaml::Hex8>((IO *)this,Val,true,(EmptyContext *)SaveInfo);
      (**(code **)(*(long *)this + 0x50))(this,local_40);
    }
  }
  (**(code **)(*(long *)this + 0x58))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}